

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::Own<capnp::ClientHook>,_kj::Own<capnp::PipelineHook>,_kj::CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++:411:9),_kj::Array<capnp::PipelineOp>_>,_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Own<capnp::ClientHook>,_kj::Own<capnp::PipelineHook>,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:411:9),_kj::Array<capnp::PipelineOp>_>,_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::Own<capnp::PipelineHook>_> depResult;
  Exception local_5a8;
  ExceptionOr<kj::Own<capnp::ClientHook>_> local_448;
  ExceptionOr<kj::Own<capnp::PipelineHook>_> local_2d8;
  Exception local_168;
  
  local_2d8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_2d8.value.ptr.disposer = (Disposer *)0x0;
  local_2d8.value.ptr.ptr = (PipelineHook *)0x0;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_2d8.super_ExceptionOrValue);
  if (local_2d8.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::Exception(&local_168,&local_2d8.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_5a8.ownFile.content.ptr = local_168.ownFile.content.ptr;
    local_5a8.ownFile.content.size_ = local_168.ownFile.content.size_;
    local_5a8.ownFile.content.disposer = local_168.ownFile.content.disposer;
    local_168.ownFile.content.ptr = (char *)0x0;
    local_168.ownFile.content.size_ = 0;
    local_5a8.file = local_168.file;
    local_5a8.line = local_168.line;
    local_5a8.type = local_168.type;
    local_5a8.description.content.ptr = local_168.description.content.ptr;
    local_5a8.description.content.size_ = local_168.description.content.size_;
    local_168.description.content.ptr = (char *)0x0;
    local_168.description.content.size_ = 0;
    local_5a8.description.content.disposer = local_168.description.content.disposer;
    local_5a8.context.ptr.disposer = local_168.context.ptr.disposer;
    local_5a8.context.ptr.ptr = local_168.context.ptr.ptr;
    local_168.context.ptr.ptr = (Context *)0x0;
    memcpy(local_5a8.trace,local_168.trace,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_448,&local_5a8);
    local_448.value.ptr.disposer = (Disposer *)0x0;
    local_448.value.ptr.ptr = (ClientHook *)0x0;
    Exception::~Exception(&local_5a8);
    ExceptionOr<kj::Own<capnp::ClientHook>_>::operator=
              ((ExceptionOr<kj::Own<capnp::ClientHook>_> *)output,&local_448);
    ExceptionOr<kj::Own<capnp::ClientHook>_>::~ExceptionOr(&local_448);
    Exception::~Exception(&local_168);
  }
  else if (local_2d8.value.ptr.ptr != (PipelineHook *)0x0) {
    CaptureByMove<capnp::QueuedPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::$_0,kj::Array<capnp::PipelineOp>>
    ::operator()((CaptureByMove<capnp::QueuedPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::__0,kj::Array<capnp::PipelineOp>>
                  *)&local_5a8,(Own<capnp::PipelineHook> *)&this->func);
    local_448.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_448.value.ptr.disposer = (Disposer *)local_5a8.ownFile.content.ptr;
    local_448.value.ptr.ptr = (ClientHook *)local_5a8.ownFile.content.size_;
    local_5a8.ownFile.content.size_ = 0;
    ExceptionOr<kj::Own<capnp::ClientHook>_>::operator=
              ((ExceptionOr<kj::Own<capnp::ClientHook>_> *)output,&local_448);
    ExceptionOr<kj::Own<capnp::ClientHook>_>::~ExceptionOr(&local_448);
    Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&local_5a8);
  }
  ExceptionOr<kj::Own<capnp::PipelineHook>_>::~ExceptionOr(&local_2d8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }